

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtl.cc
# Opt level: O1

void __thiscall hgdb::rtl::Serializer::handle(Serializer *this,InstanceSymbol *inst)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  SymbolTable *this_00;
  char *pcVar2;
  Scope<std::nullptr_t> *pSVar3;
  ScopeBase *pSVar4;
  Definition *__k;
  iterator iVar5;
  iterator iVar6;
  Module *m;
  Scope<std::nullptr_t> *pSVar7;
  undefined8 uVar8;
  string_view sVar9;
  string filename;
  path local_f8;
  InstanceSymbol *local_d0;
  Module *local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  long *local_a0 [2];
  long local_90 [2];
  path local_80;
  path local_58;
  
  local_d0 = inst;
  __k = slang::ast::InstanceSymbol::getDefinition(inst);
  iVar5 = std::
          _Hashtable<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
          ::find(&(this->definitions_)._M_h,&__k->name);
  if (iVar5.super__Node_iterator_base<std::basic_string_view<char,_std::char_traits<char>_>,_true>.
      _M_cur == (__node_type *)0x0) {
    this_00 = this->table_;
    pcVar2 = (__k->name)._M_str;
    paVar1 = &local_f8._M_pathname.field_2;
    local_f8._M_pathname._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_f8,pcVar2,pcVar2 + (__k->name)._M_len);
    m = json::SymbolTable::add_module(this_00,&local_f8._M_pathname);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f8._M_pathname._M_dataplus._M_p != paVar1) {
      operator_delete(local_f8._M_pathname._M_dataplus._M_p,
                      local_f8._M_pathname.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    iVar6 = std::
            _Hashtable<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_hgdb::json::Module_*>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_hgdb::json::Module_*>_>,_std::__detail::_Select1st,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
            ::find(&(this->def_module_mapping_)._M_h,&__k->name);
    if (iVar6.
        super__Node_iterator_base<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_hgdb::json::Module_*>,_true>
        ._M_cur == (__node_type *)0x0) {
      uVar8 = std::__throw_out_of_range("_Map_base::at");
      if ((Definition *)local_c0._M_dataplus._M_p != __k) {
        operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
      }
      _Unwind_Resume(uVar8);
    }
    m = *(Module **)
         ((long)iVar6.
                super__Node_iterator_base<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_hgdb::json::Module_*>,_true>
                ._M_cur + 0x18);
  }
  local_c8 = this->current_module_;
  if (local_c8 != (Module *)0x0) {
    pcVar2 = (local_d0->super_InstanceSymbolBase).super_Symbol.name._M_str;
    paVar1 = &local_f8._M_pathname.field_2;
    local_f8._M_pathname._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_f8,pcVar2,
               pcVar2 + (local_d0->super_InstanceSymbolBase).super_Symbol.name._M_len);
    json::Module::add_instance(local_c8,&local_f8._M_pathname,m);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f8._M_pathname._M_dataplus._M_p != paVar1) {
      operator_delete(local_f8._M_pathname._M_dataplus._M_p,
                      local_f8._M_pathname.field_2._M_allocated_capacity + 1);
    }
  }
  if (iVar5.super__Node_iterator_base<std::basic_string_view<char,_std::char_traits<char>_>,_true>.
      _M_cur == (__node_type *)0x0) {
    std::
    _Hashtable<std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>,std::__detail::_Identity,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::hash<std::basic_string_view<char,std::char_traits<char>>>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
    ::_M_emplace<std::basic_string_view<char,std::char_traits<char>>const&>
              ((_Hashtable<std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>,std::__detail::_Identity,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::hash<std::basic_string_view<char,std::char_traits<char>>>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                *)&this->definitions_,__k);
    this->current_module_ = m;
    std::
    _Hashtable<std::basic_string_view<char,std::char_traits<char>>,std::pair<std::basic_string_view<char,std::char_traits<char>>const,hgdb::json::Module*>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,hgdb::json::Module*>>,std::__detail::_Select1st,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::hash<std::basic_string_view<char,std::char_traits<char>>>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
    ::_M_emplace<std::basic_string_view<char,std::char_traits<char>>const&,hgdb::json::Module*&>
              ((_Hashtable<std::basic_string_view<char,std::char_traits<char>>,std::pair<std::basic_string_view<char,std::char_traits<char>>const,hgdb::json::Module*>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,hgdb::json::Module*>>,std::__detail::_Select1st,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::hash<std::basic_string_view<char,std::char_traits<char>>>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                *)&this->def_module_mapping_,__k,&this->current_module_);
    pSVar3 = this->current_scope_;
    pSVar4 = this->root_scope_;
    pSVar7 = json::Scope<hgdb::json::Module>::create_scope<hgdb::json::Scope<decltype(nullptr)>>
                       (&this->current_module_->super_Scope<hgdb::json::Module>);
    this->current_scope_ = pSVar7;
    sVar9 = slang::SourceManager::getFileName
                      (this->sm_,(local_d0->super_InstanceSymbolBase).super_Symbol.location);
    local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_c0,sVar9._M_str,sVar9._M_str + sVar9._M_len);
    std::filesystem::__cxx11::path::path<std::__cxx11::string,std::filesystem::__cxx11::path>
              (&local_80,&local_c0,auto_format);
    std::filesystem::absolute(&local_58);
    std::filesystem::canonical(&local_f8);
    local_a0[0] = local_90;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_a0,local_f8._M_pathname._M_dataplus._M_p,
               local_f8._M_pathname._M_dataplus._M_p + local_f8._M_pathname._M_string_length);
    std::__cxx11::string::operator=((string *)&local_c0,(string *)local_a0);
    if (local_a0[0] != local_90) {
      operator_delete(local_a0[0],local_90[0] + 1);
    }
    std::filesystem::__cxx11::path::~path(&local_f8);
    std::filesystem::__cxx11::path::~path(&local_58);
    std::filesystem::__cxx11::path::~path(&local_80);
    paVar1 = &local_f8._M_pathname.field_2;
    local_f8._M_pathname._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_f8,local_c0._M_dataplus._M_p,
               local_c0._M_dataplus._M_p + local_c0._M_string_length);
    std::__cxx11::string::operator=((string *)&this->current_scope_->filename,(string *)&local_f8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f8._M_pathname._M_dataplus._M_p != paVar1) {
      operator_delete(local_f8._M_pathname._M_dataplus._M_p,
                      local_f8._M_pathname.field_2._M_allocated_capacity + 1);
    }
    this->root_scope_ = &this->current_scope_->super_ScopeBase;
    slang::ast::Symbol::visit<hgdb::rtl::Serializer&>(&local_d0->body->super_Symbol,this);
    this->current_module_ = local_c8;
    this->current_scope_ = pSVar3;
    this->root_scope_ = pSVar4;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
      operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
    }
  }
  return;
}

Assistant:

void handle(const slang::ast::InstanceSymbol &inst) {
        auto const *def = &inst.getDefinition();
        hgdb::json::Module *inst_module = nullptr;
        auto visited = definitions_.find(def->name) != definitions_.end();
        if (!visited) {
            inst_module = table_.add_module(std::string(def->name));
        } else {
            inst_module = def_module_mapping_.at(def->name);
        }

        auto *parent_module = current_module_;

        if (parent_module) {
            parent_module->add_instance(std::string(inst.name), inst_module);
        }

        // only visit unique definition
        if (visited) return;
        definitions_.emplace(def->name);

        current_module_ = inst_module;
        def_module_mapping_.emplace(def->name, current_module_);

        auto *temp_current_scope_ = current_scope_;
        auto *temp_root_scope_ = root_scope_;
        // to make things easier, everything is wrapped in a single scope
        current_scope_ = current_module_->create_scope<hgdb::json::Scope<>>();
        auto filename = std::string(sm_.getFileName(inst.location));
        filename = std::filesystem::canonical(std::filesystem::absolute(filename)).string();
        current_scope_->filename = std::string(filename);
        root_scope_ = current_scope_;

        visitDefault(inst);
        // reset
        current_module_ = parent_module;
        current_scope_ = temp_current_scope_;
        root_scope_ = temp_root_scope_;
    }